

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::Gemm_x86_fma::forward_int8
          (Gemm_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *B;
  float fVar1;
  float fVar2;
  pointer pMVar3;
  Mat *this_00;
  Mat *A;
  void *pvVar4;
  int max_kk;
  float max_kk_00;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ulong uVar9;
  Gemm_x86_fma *pGVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  float fVar15;
  int iVar16;
  int iVar17;
  size_t sVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  float fVar22;
  uint broadcast_type_C;
  long lVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  float fVar29;
  ulong uVar30;
  uint uVar31;
  int *piVar32;
  bool bVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  float B_int8_scale;
  int TILE_K;
  Gemm_x86_fma *local_350;
  Mat local_348;
  long local_2f8;
  ulong local_2e0;
  Mat m_1;
  Mat m_3;
  Mat m;
  Mat local_1e8;
  Mat local_198;
  Mat m_2;
  int TILE_K_2;
  int TILE_M;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  int local_c0;
  Allocator *local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  int local_a0;
  size_t local_98;
  int local_88;
  float B_int8_scale_1;
  ulong local_80;
  int TILE_N;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  int local_60;
  Allocator *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  int local_40;
  size_t local_38;
  
  iVar27 = (this->super_Gemm).constantA;
  iVar14 = (this->super_Gemm).constantB;
  if (iVar14 != 0 && iVar27 != 0) {
    uVar31 = (this->super_Gemm).constantM;
LAB_004fc5b1:
    uVar26 = (this->super_Gemm).constantN;
  }
  else {
    pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar27 == 0) {
      iVar17 = (this->super_Gemm).transA;
      if (iVar14 != 0) {
        if (iVar17 == 0) {
          uVar31 = pMVar3->elempack * (&pMVar3->h)[(ulong)(pMVar3->dims == 3) * 2];
        }
        else {
          uVar31 = pMVar3->w;
        }
        goto LAB_004fc5b1;
      }
      if (iVar17 == 0) {
        uVar31 = pMVar3->elempack * (&pMVar3->h)[(ulong)(pMVar3->dims == 3) * 2];
      }
      else {
        uVar31 = pMVar3->w;
      }
      if ((this->super_Gemm).transB == 0) {
        uVar26 = pMVar3[1].w;
      }
      else {
        uVar26 = pMVar3[1].elempack * (&pMVar3[1].h)[(ulong)(pMVar3[1].dims == 3) * 2];
      }
    }
    else {
      uVar31 = (this->super_Gemm).constantM;
      if ((this->super_Gemm).transB == 0) {
        uVar26 = pMVar3->w;
      }
      else {
        uVar26 = pMVar3->elempack * (&pMVar3->h)[(ulong)(pMVar3->dims == 3) * 2];
      }
    }
  }
  local_348.cstep = 0;
  local_348.data = (void *)0x0;
  local_348.refcount._0_4_ = 0;
  local_348.refcount._4_4_ = 0;
  local_348.elemsize._0_4_ = 0;
  local_348.elemsize._4_4_ = 0;
  local_348.elempack = 0;
  local_348.allocator = (Allocator *)0x0;
  local_348.dims = 0;
  local_348.w = 0;
  local_348.h = 0;
  local_348.d = 0;
  local_348.c = 0;
  local_350 = this;
  if ((this->super_Gemm).constantC == 0) {
    pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar23 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar3;
    if (iVar14 != 0 && iVar27 != 0) {
      if (lVar23 == 0x48) {
        local_348.data = pMVar3->data;
        piVar32 = pMVar3->refcount;
        sVar18 = pMVar3->elemsize;
        local_348.elempack = pMVar3->elempack;
        local_348.allocator = pMVar3->allocator;
        uVar34._0_4_ = pMVar3->dims;
        uVar34._4_4_ = pMVar3->w;
        uVar38._0_4_ = pMVar3->h;
        uVar38._4_4_ = pMVar3->d;
        local_348.c = pMVar3->c;
        local_348.cstep = pMVar3->cstep;
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + 1;
          UNLOCK();
        }
      }
      else {
        uVar34 = 0;
        uVar38 = 0;
        local_348.allocator = (Allocator *)0x0;
        local_348.elempack = 0;
        sVar18 = 0;
        piVar32 = (int *)0x0;
        local_348.data = (void *)0x0;
        local_348.c = 0;
        local_348.cstep = 0;
      }
      if (piVar32 != (int *)0x0) {
        LOCK();
        *piVar32 = *piVar32 + 1;
        UNLOCK();
      }
      local_348.refcount._0_4_ = SUB84(piVar32,0);
      local_348.refcount._4_4_ = (undefined4)((ulong)piVar32 >> 0x20);
      local_348.elemsize._0_4_ = (undefined4)sVar18;
      local_348.elemsize._4_4_ = (undefined4)(sVar18 >> 0x20);
      local_348.dims = (int)uVar34;
      local_348.w = (int)((ulong)uVar34 >> 0x20);
      local_348.h = (int)uVar38;
      local_348.d = (int)((ulong)uVar38 >> 0x20);
      if (piVar32 != (int *)0x0) {
        LOCK();
        *piVar32 = *piVar32 + -1;
        UNLOCK();
        if (*piVar32 == 0) {
          if (local_348.allocator == (Allocator *)0x0) goto LAB_004ff647;
          (*(local_348.allocator)->_vptr_Allocator[3])(local_348.allocator,local_348.data);
        }
      }
    }
    else if (iVar27 == 0) {
      if (iVar14 == 0) {
        if (lVar23 == 0xd8) {
          local_348.data = pMVar3[2].data;
          piVar32 = pMVar3[2].refcount;
          sVar18 = pMVar3[2].elemsize;
          local_348.elempack = pMVar3[2].elempack;
          local_348.allocator = pMVar3[2].allocator;
          uVar37._0_4_ = pMVar3[2].dims;
          uVar37._4_4_ = pMVar3[2].w;
          uVar41._0_4_ = pMVar3[2].h;
          uVar41._4_4_ = pMVar3[2].d;
          local_348.c = pMVar3[2].c;
          local_348.cstep = pMVar3[2].cstep;
          if (piVar32 != (int *)0x0) {
            LOCK();
            *piVar32 = *piVar32 + 1;
            UNLOCK();
          }
        }
        else {
          uVar37 = 0;
          uVar41 = 0;
          local_348.cstep = 0;
          local_348.c = 0;
          local_348.allocator = (Allocator *)0x0;
          local_348.elempack = 0;
          sVar18 = 0;
          piVar32 = (int *)0x0;
          local_348.data = (void *)0x0;
        }
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + 1;
          UNLOCK();
        }
        local_348.refcount._0_4_ = SUB84(piVar32,0);
        local_348.refcount._4_4_ = (undefined4)((ulong)piVar32 >> 0x20);
        local_348.elemsize._0_4_ = (undefined4)sVar18;
        local_348.elemsize._4_4_ = (undefined4)(sVar18 >> 0x20);
        local_348.dims = (int)uVar37;
        local_348.w = (int)((ulong)uVar37 >> 0x20);
        local_348.h = (int)uVar41;
        local_348.d = (int)((ulong)uVar41 >> 0x20);
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + -1;
          UNLOCK();
          if (*piVar32 == 0) {
            if (local_348.allocator == (Allocator *)0x0) goto LAB_004ff647;
            (*(local_348.allocator)->_vptr_Allocator[3])(local_348.allocator,local_348.data);
          }
        }
      }
      else {
        if (lVar23 == 0x90) {
          local_348.data = pMVar3[1].data;
          piVar32 = pMVar3[1].refcount;
          sVar18 = pMVar3[1].elemsize;
          local_348.elempack = pMVar3[1].elempack;
          local_348.allocator = pMVar3[1].allocator;
          uVar36._0_4_ = pMVar3[1].dims;
          uVar36._4_4_ = pMVar3[1].w;
          uVar40._0_4_ = pMVar3[1].h;
          uVar40._4_4_ = pMVar3[1].d;
          local_348.c = pMVar3[1].c;
          local_348.cstep = pMVar3[1].cstep;
          if (piVar32 != (int *)0x0) {
            LOCK();
            *piVar32 = *piVar32 + 1;
            UNLOCK();
          }
        }
        else {
          uVar36 = 0;
          uVar40 = 0;
          local_348.cstep = 0;
          local_348.c = 0;
          local_348.allocator = (Allocator *)0x0;
          local_348.elempack = 0;
          sVar18 = 0;
          piVar32 = (int *)0x0;
          local_348.data = (void *)0x0;
        }
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + 1;
          UNLOCK();
        }
        local_348.refcount._0_4_ = SUB84(piVar32,0);
        local_348.refcount._4_4_ = (undefined4)((ulong)piVar32 >> 0x20);
        local_348.elemsize._0_4_ = (undefined4)sVar18;
        local_348.elemsize._4_4_ = (undefined4)(sVar18 >> 0x20);
        local_348.dims = (int)uVar36;
        local_348.w = (int)((ulong)uVar36 >> 0x20);
        local_348.h = (int)uVar40;
        local_348.d = (int)((ulong)uVar40 >> 0x20);
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + -1;
          UNLOCK();
          if (*piVar32 == 0) {
            if (local_348.allocator == (Allocator *)0x0) {
LAB_004ff647:
              if (local_348.data != (void *)0x0) {
                free(local_348.data);
              }
            }
            else {
              (*(local_348.allocator)->_vptr_Allocator[3])(local_348.allocator,local_348.data);
            }
          }
        }
      }
    }
    else {
      if (lVar23 == 0x90) {
        local_348.data = pMVar3[1].data;
        piVar32 = pMVar3[1].refcount;
        sVar18 = pMVar3[1].elemsize;
        local_348.elempack = pMVar3[1].elempack;
        local_348.allocator = pMVar3[1].allocator;
        uVar35._0_4_ = pMVar3[1].dims;
        uVar35._4_4_ = pMVar3[1].w;
        uVar39._0_4_ = pMVar3[1].h;
        uVar39._4_4_ = pMVar3[1].d;
        local_348.c = pMVar3[1].c;
        local_348.cstep = pMVar3[1].cstep;
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + 1;
          UNLOCK();
        }
      }
      else {
        uVar35 = 0;
        uVar39 = 0;
        local_348.cstep = 0;
        local_348.c = 0;
        local_348.allocator = (Allocator *)0x0;
        local_348.elempack = 0;
        sVar18 = 0;
        piVar32 = (int *)0x0;
        local_348.data = (void *)0x0;
      }
      if (piVar32 != (int *)0x0) {
        LOCK();
        *piVar32 = *piVar32 + 1;
        UNLOCK();
      }
      local_348.refcount._0_4_ = SUB84(piVar32,0);
      local_348.refcount._4_4_ = (undefined4)((ulong)piVar32 >> 0x20);
      local_348.elemsize._0_4_ = (undefined4)sVar18;
      local_348.elemsize._4_4_ = (undefined4)(sVar18 >> 0x20);
      local_348.dims = (int)uVar35;
      local_348.w = (int)((ulong)uVar35 >> 0x20);
      local_348.h = (int)uVar39;
      local_348.d = (int)((ulong)uVar39 >> 0x20);
      if (piVar32 != (int *)0x0) {
        LOCK();
        *piVar32 = *piVar32 + -1;
        UNLOCK();
        if (*piVar32 == 0) {
          if (local_348.allocator == (Allocator *)0x0) goto LAB_004ff647;
          (*(local_348.allocator)->_vptr_Allocator[3])(local_348.allocator,local_348.data);
        }
      }
    }
    broadcast_type_C = 0;
    if ((local_348.data != (void *)0x0) && ((long)local_348.c * local_348.cstep != 0)) {
      uVar11 = 4;
      if (local_348.elempack * local_348.w != uVar26) {
        uVar11 = (uint)(local_348.elempack * local_348.w == uVar31 && local_348.dims == 1);
      }
      broadcast_type_C = 0;
      if (local_348.dims == 1) {
        broadcast_type_C = uVar11;
      }
      uVar11 = local_348.dims ^ 2;
      if ((local_348.w == 1 && uVar11 == 0) && (local_348.elempack * local_348.h == uVar31)) {
        broadcast_type_C = 2;
      }
      if ((uVar11 == 0 && local_348.w == uVar26) && (local_348.elempack * local_348.h == uVar31)) {
        broadcast_type_C = 3;
      }
      if ((uVar11 == 0 && local_348.w == uVar26) && (local_348.elempack * local_348.h == 1)) {
        broadcast_type_C = 4;
      }
    }
  }
  else {
    if (&local_348 != &this->CT_data) {
      piVar32 = (this->CT_data).refcount;
      if (piVar32 != (int *)0x0) {
        LOCK();
        *piVar32 = *piVar32 + 1;
        UNLOCK();
      }
      local_348.data = (this->CT_data).data;
      piVar32 = (this->CT_data).refcount;
      local_348.refcount._0_4_ = SUB84(piVar32,0);
      local_348.refcount._4_4_ = (undefined4)((ulong)piVar32 >> 0x20);
      sVar18 = (this->CT_data).elemsize;
      local_348.elemsize._0_4_ = (undefined4)sVar18;
      local_348.elemsize._4_4_ = (undefined4)(sVar18 >> 0x20);
      local_348.elempack = (this->CT_data).elempack;
      local_348.allocator = (this->CT_data).allocator;
      uVar5 = (this->CT_data).dims;
      uVar6 = (this->CT_data).w;
      uVar7 = (this->CT_data).h;
      uVar8 = (this->CT_data).d;
      local_348.c = (this->CT_data).c;
      local_348.cstep = (this->CT_data).cstep;
      local_348.dims = uVar5;
      local_348.w = uVar6;
      local_348.h = uVar7;
      local_348.d = uVar8;
    }
    broadcast_type_C = (this->super_Gemm).constant_broadcast_type_C;
  }
  pGVar10 = local_350;
  iVar27 = 1;
  if (opt->use_packing_layout == true) {
    uVar11 = uVar26;
    if ((local_350->super_Gemm).output_transpose == 0) {
      uVar11 = uVar31;
    }
    iVar27 = 8;
    if ((uVar11 & 7) != 0) {
      iVar27 = (uint)((uVar11 & 3) == 0) * 3 + 1;
    }
  }
  iVar14 = (local_350->super_Gemm).output_elempack;
  if (iVar14 != 0) {
    iVar27 = iVar14;
  }
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar11 = uVar26;
  if ((local_350->super_Gemm).output_transpose != 0) {
    uVar11 = uVar31;
    uVar31 = uVar26;
  }
  if ((local_350->super_Gemm).output_N1M == 0) {
    Mat::create(this_00,uVar11,(int)uVar31 / iVar27,(ulong)(uint)(iVar27 * 4),iVar27,
                opt->blob_allocator);
  }
  else {
    Mat::create(this_00,uVar11,1,(int)uVar31 / iVar27,(ulong)(uint)(iVar27 * 4),iVar27,
                opt->blob_allocator);
  }
  iVar27 = -100;
  if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) goto LAB_004ffcc6;
  iVar27 = *(int *)&(pGVar10->super_Gemm).field_0x244;
  iVar14 = iVar27;
  if (iVar27 == 0) {
    iVar14 = opt->num_threads;
  }
  if (opt->num_threads != iVar27 && iVar27 != 0) {
    forward_int8();
  }
  iVar27 = (pGVar10->super_Gemm).constantA;
  iVar17 = (pGVar10->super_Gemm).constantB;
  if (iVar17 == 0 || iVar27 == 0) {
    A = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
    if (iVar27 != 0) {
      uVar31 = (pGVar10->super_Gemm).constantM;
      iVar17 = (pGVar10->super_Gemm).constantK;
      iVar12 = (pGVar10->super_Gemm).transB;
      if (iVar12 == 0) {
        uVar26 = A->w;
      }
      else {
        uVar26 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
      }
      uVar19 = (ulong)uVar26;
      iVar21 = (pGVar10->super_Gemm).output_transpose;
      fVar1 = (pGVar10->super_Gemm).alpha;
      fVar2 = (pGVar10->super_Gemm).beta;
      get_optimal_tile_mnk_int8
                (uVar31,uVar26,iVar17,(pGVar10->super_Gemm).constant_TILE_M,
                 (pGVar10->super_Gemm).constant_TILE_N,(pGVar10->super_Gemm).constant_TILE_K,&TILE_M
                 ,&TILE_N,&TILE_K,iVar14);
      uVar11 = (int)(uVar31 + TILE_M + -1) / TILE_M;
      iVar25 = (int)(uVar26 + TILE_N + -1) / TILE_N;
      iVar28 = (iVar17 + TILE_K + -1) / TILE_K;
      local_1e8.cstep = 0;
      local_1e8.data = (void *)0x0;
      local_1e8.refcount._0_4_ = 0;
      local_1e8.refcount._4_4_ = 0;
      local_1e8.elemsize._0_4_ = 0;
      local_1e8.elemsize._4_4_ = 0;
      local_1e8.elempack = 0;
      local_1e8.allocator = (Allocator *)0x0;
      local_1e8.dims = 0;
      local_1e8.w = 0;
      local_1e8.h = 0;
      local_1e8.d = 0;
      local_1e8.c = 0;
      Mat::create(&local_1e8,TILE_K * TILE_N,iVar28,iVar25,1,opt->workspace_allocator);
      iVar27 = -100;
      local_2e0 = uVar19;
      if ((local_1e8.data != (void *)0x0) && ((long)local_1e8.c * local_1e8.cstep != 0)) {
        compute_B_int8_scale(A,&B_int8_scale);
        local_198.cstep = 0;
        local_198.data = (void *)0x0;
        local_198.refcount._0_4_ = 0;
        local_198.refcount._4_4_ = 0;
        local_198.elemsize._0_4_ = 0;
        local_198.elemsize._4_4_ = 0;
        local_198.elempack = 0;
        local_198.allocator = (Allocator *)0x0;
        local_198.dims = 0;
        local_198.w = 0;
        local_198.h = 0;
        local_198.d = 0;
        local_198.c = 0;
        Mat::create(&local_198,uVar31,4,opt->workspace_allocator);
        iVar27 = -100;
        if ((local_198.data != (void *)0x0) && ((long)local_198.c * local_198.cstep != 0)) {
          iVar25 = iVar25 * iVar28;
          if (0 < (int)uVar31) {
            pvVar4 = (pGVar10->super_Gemm).A_data_int8_scales.data;
            uVar19 = 0;
            do {
              *(float *)((long)local_198.data + uVar19 * 4) =
                   1.0 / (B_int8_scale * *(float *)((long)pvVar4 + uVar19 * 4));
              uVar19 = uVar19 + 1;
            } while (uVar31 != uVar19);
          }
          if (0 < iVar25) {
            iVar27 = 0;
            do {
              iVar16 = TILE_N * (iVar27 / iVar28);
              iVar24 = TILE_K * (int)((long)iVar27 % (long)iVar28);
              iVar13 = (int)local_2e0 - iVar16;
              if (TILE_N < iVar13) {
                iVar13 = TILE_N;
              }
              iVar20 = iVar17 - iVar24;
              if (TILE_K < iVar17 - iVar24) {
                iVar20 = TILE_K;
              }
              m_3.cstep = (size_t)local_1e8.w;
              m_3.data = (void *)((long)local_1e8.data +
                                 ((long)iVar27 % (long)iVar28 & 0xffffffffU) * m_3.cstep *
                                 CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize) +
                                 (long)(iVar27 / iVar28) * local_1e8.cstep *
                                 CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize));
              m_3.refcount._0_4_ = 0;
              m_3.refcount._4_4_ = 0;
              m_3.elemsize._0_4_ = (undefined4)local_1e8.elemsize;
              m_3.elemsize._4_4_ = local_1e8.elemsize._4_4_;
              m_3.elempack = local_1e8.elempack;
              m_3.allocator = local_1e8.allocator;
              m_3.dims = 2;
              m_3.w = local_1e8.w;
              m_3.h = 1;
              m_3.d = 1;
              m_3.c = 1;
              if (iVar12 == 0) {
                transpose_pack_B_tile_quantize(A,&m_3,iVar16,iVar13,iVar24,iVar20,B_int8_scale);
              }
              else {
                pack_B_tile_quantize(A,&m_3,iVar16,iVar13,iVar24,iVar20,B_int8_scale);
              }
              piVar32 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
              if (piVar32 != (int *)0x0) {
                LOCK();
                *piVar32 = *piVar32 + -1;
                UNLOCK();
                if (*piVar32 == 0) {
                  if (m_3.allocator == (Allocator *)0x0) {
                    if (m_3.data != (void *)0x0) {
                      free(m_3.data);
                    }
                  }
                  else {
                    (*(m_3.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              iVar27 = iVar27 + 1;
            } while (iVar25 != iVar27);
          }
          iVar12 = TILE_M;
          local_2f8 = CONCAT44(local_2f8._4_4_,TILE_N);
          m_3.cstep = 0;
          m_3.data = (void *)0x0;
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = 0;
          m_3.elemsize._4_4_ = 0;
          m_3.elempack = 0;
          m_3.allocator = (Allocator *)0x0;
          m_3.dims = 0;
          m_3.w = 0;
          m_3.h = 0;
          m_3.d = 0;
          m_3.c = 0;
          Mat::create(&m_3,TILE_M * TILE_N,1,iVar14,4,opt->workspace_allocator);
          iVar27 = -100;
          if ((m_3.data != (void *)0x0) && ((long)m_3.c * m_3.cstep != 0)) {
            if ((int)uVar11 < 1) {
              iVar27 = 0;
            }
            else {
              uVar30 = 0;
              uVar19 = local_2e0;
              do {
                iVar14 = iVar12 * (int)uVar30;
                iVar27 = uVar31 - iVar14;
                if (iVar12 < (int)(uVar31 - iVar14)) {
                  iVar27 = iVar12;
                }
                iVar25 = get_omp_thread_num();
                uVar9 = CONCAT44(m_3.elemsize._4_4_,(undefined4)m_3.elemsize);
                m.data = (void *)((long)iVar25 * m_3.cstep * uVar9 + (long)m_3.data);
                m.refcount._0_4_ = 0;
                m.refcount._4_4_ = 0;
                m.elemsize._0_4_ = (undefined4)m_3.elemsize;
                m.elemsize._4_4_ = m_3.elemsize._4_4_;
                m.elempack = m_3.elempack;
                m.allocator = m_3.allocator;
                m.w = m_3.w;
                m.h = m_3.h;
                m.d = 1;
                m.c = m_3.d;
                m.dims = m_3.dims + -1;
                m.cstep = (uVar9 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar9;
                if (m_3.dims == 4) {
                  m.cstep = (long)m_3.h * (long)m_3.w;
                }
                if (0 < (int)uVar19) {
                  iVar25 = 0;
                  do {
                    iVar28 = (int)uVar19 - iVar25;
                    if ((int)local_2f8 < iVar28) {
                      iVar28 = (int)local_2f8;
                    }
                    if (0 < iVar17) {
                      iVar16 = iVar25 / (int)local_2f8;
                      iVar24 = 0;
                      iVar13 = iVar17;
                      do {
                        iVar20 = iVar13;
                        if (TILE_K < iVar13) {
                          iVar20 = TILE_K;
                        }
                        m_1.w = (local_350->AT_data).w;
                        m_1.cstep = (size_t)m_1.w;
                        sVar18 = (local_350->AT_data).elemsize;
                        m_1.elempack = (local_350->AT_data).elempack;
                        m_1.allocator = (local_350->AT_data).allocator;
                        m_1.data = (void *)((long)(local_350->AT_data).data +
                                           sVar18 * m_1.cstep * (long)(iVar24 / TILE_K) +
                                           (local_350->AT_data).cstep * uVar30 * sVar18);
                        m_1.refcount._0_4_ = 0;
                        m_1.refcount._4_4_ = 0;
                        m_1.elemsize._0_4_ = (undefined4)sVar18;
                        m_1.elemsize._4_4_ = (undefined4)(sVar18 >> 0x20);
                        m_1.dims = 2;
                        m_1.h = 1;
                        m_1.d = 1;
                        m_1.c = 1;
                        m_2.cstep = (size_t)local_1e8.w;
                        m_2.data = (void *)((long)local_1e8.data +
                                           m_2.cstep *
                                           CONCAT44(local_1e8.elemsize._4_4_,
                                                    (undefined4)local_1e8.elemsize) *
                                           (long)(iVar24 / TILE_K) +
                                           local_1e8.cstep * (long)iVar16 *
                                           CONCAT44(local_1e8.elemsize._4_4_,
                                                    (undefined4)local_1e8.elemsize));
                        m_2.refcount._0_4_ = 0;
                        m_2.refcount._4_4_ = 0;
                        m_2.elemsize._0_4_ = (undefined4)local_1e8.elemsize;
                        m_2.elemsize._4_4_ = local_1e8.elemsize._4_4_;
                        m_2.elempack = local_1e8.elempack;
                        m_2.allocator = local_1e8.allocator;
                        m_2.w = local_1e8.w;
                        m_2.dims = 2;
                        m_2.h = 1;
                        m_2.d = 1;
                        m_2.c = 1;
                        gemm_transB_packed_tile_int8
                                  (&m_1,&m_2,&m,iVar14,iVar27,iVar25,iVar28,iVar24,iVar20);
                        piVar32 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
                        if (piVar32 != (int *)0x0) {
                          LOCK();
                          *piVar32 = *piVar32 + -1;
                          UNLOCK();
                          if (*piVar32 == 0) {
                            if (m_2.allocator == (Allocator *)0x0) {
                              if (m_2.data != (void *)0x0) {
                                free(m_2.data);
                              }
                            }
                            else {
                              (*(m_2.allocator)->_vptr_Allocator[3])();
                            }
                          }
                        }
                        m_2.cstep = 0;
                        m_2.data = (void *)0x0;
                        m_2.refcount._0_4_ = 0;
                        m_2.refcount._4_4_ = 0;
                        m_2.elemsize._0_4_ = 0;
                        m_2.elemsize._4_4_ = 0;
                        m_2.elempack = 0;
                        m_2.dims = 0;
                        m_2.w = 0;
                        m_2.h = 0;
                        m_2.d = 0;
                        m_2.c = 0;
                        piVar32 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                        if (piVar32 != (int *)0x0) {
                          LOCK();
                          *piVar32 = *piVar32 + -1;
                          UNLOCK();
                          if (*piVar32 == 0) {
                            if (m_1.allocator == (Allocator *)0x0) {
                              if (m_1.data != (void *)0x0) {
                                free(m_1.data);
                              }
                            }
                            else {
                              (*(m_1.allocator)->_vptr_Allocator[3])();
                            }
                          }
                        }
                        m_1.cstep = 0;
                        m_1.data = (void *)0x0;
                        m_1.refcount._0_4_ = 0;
                        m_1.refcount._4_4_ = 0;
                        m_1.elemsize._0_4_ = 0;
                        m_1.elemsize._4_4_ = 0;
                        m_1.elempack = 0;
                        m_1.dims = 0;
                        m_1.w = 0;
                        m_1.h = 0;
                        m_1.d = 0;
                        m_1.c = 0;
                        iVar24 = iVar24 + TILE_K;
                        iVar13 = iVar13 - TILE_K;
                      } while (iVar24 < iVar17);
                    }
                    unpack_output_tile_dequantize
                              (&m,&local_348,this_00,broadcast_type_C,iVar14,iVar27,iVar25,iVar28,
                               &local_198,fVar1,fVar2,iVar21);
                    iVar25 = iVar25 + (int)local_2f8;
                    uVar19 = local_2e0;
                  } while (iVar25 < (int)local_2e0);
                }
                piVar32 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                if (piVar32 != (int *)0x0) {
                  LOCK();
                  *piVar32 = *piVar32 + -1;
                  UNLOCK();
                  if (*piVar32 == 0) {
                    if (m.allocator == (Allocator *)0x0) {
                      if (m.data != (void *)0x0) {
                        free(m.data);
                      }
                    }
                    else {
                      (*(m.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                m.cstep = 0;
                m.data = (void *)0x0;
                m.refcount._0_4_ = 0;
                m.refcount._4_4_ = 0;
                m.elemsize._0_4_ = 0;
                m.elemsize._4_4_ = 0;
                m.elempack = 0;
                m.dims = 0;
                m.w = 0;
                m.h = 0;
                m.d = 0;
                m.c = 0;
                uVar30 = uVar30 + 1;
              } while (uVar30 != uVar11);
              iVar27 = 0;
            }
          }
          piVar32 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
          if (piVar32 != (int *)0x0) {
            LOCK();
            *piVar32 = *piVar32 + -1;
            UNLOCK();
            if (*piVar32 == 0) {
              if (m_3.allocator == (Allocator *)0x0) {
                if (m_3.data != (void *)0x0) {
                  free(m_3.data);
                }
              }
              else {
                (*(m_3.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m_3.cstep = 0;
          m_3.data = (void *)0x0;
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = 0;
          m_3.elemsize._4_4_ = 0;
          m_3.elempack = 0;
          m_3.dims = 0;
          m_3.w = 0;
          m_3.h = 0;
          m_3.d = 0;
          m_3.c = 0;
        }
        piVar32 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + -1;
          UNLOCK();
          if (*piVar32 == 0) {
            if (local_198.allocator == (Allocator *)0x0) {
              if (local_198.data != (void *)0x0) {
                free(local_198.data);
              }
            }
            else {
              (*(local_198.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_198.cstep = 0;
        local_198.data = (void *)0x0;
        local_198.refcount._0_4_ = 0;
        local_198.refcount._4_4_ = 0;
        local_198.elemsize._0_4_ = 0;
        local_198.elemsize._4_4_ = 0;
        local_198.elempack = 0;
        local_198.dims = 0;
        local_198.w = 0;
        local_198.h = 0;
        local_198.d = 0;
        local_198.c = 0;
      }
      piVar32 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
      if (piVar32 != (int *)0x0) {
        LOCK();
        *piVar32 = *piVar32 + -1;
        UNLOCK();
        if (*piVar32 == 0) {
          if (local_1e8.allocator == (Allocator *)0x0) {
            if (local_1e8.data != (void *)0x0) {
              free(local_1e8.data);
            }
          }
          else {
            (*(local_1e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_1e8.cstep = 0;
      local_1e8.data = (void *)0x0;
      local_1e8.refcount._0_4_ = 0;
      local_1e8.refcount._4_4_ = 0;
      local_1e8.elemsize._0_4_ = 0;
      local_1e8.elemsize._4_4_ = 0;
      local_1e8.elempack = 0;
      local_1e8.dims = 0;
      local_1e8.w = 0;
      local_1e8.h = 0;
      local_1e8.d = 0;
      local_1e8.c = 0;
      goto LAB_004ffcc6;
    }
    if (iVar17 != 0) {
      iVar17 = (pGVar10->super_Gemm).constantN;
      iVar12 = (pGVar10->super_Gemm).constantK;
      iVar27 = (pGVar10->super_Gemm).transA;
      local_2e0 = CONCAT44(local_2e0._4_4_,iVar27);
      if (iVar27 == 0) {
        iVar21 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
      }
      else {
        iVar21 = A->w;
      }
      fVar1 = (local_350->super_Gemm).B_data_int8_scale;
      iVar25 = (local_350->super_Gemm).output_transpose;
      fVar2 = (local_350->super_Gemm).alpha;
      fVar15 = (local_350->super_Gemm).beta;
      get_optimal_tile_mnk_int8
                (iVar21,iVar17,iVar12,(pGVar10->super_Gemm).constant_TILE_M,
                 (pGVar10->super_Gemm).constant_TILE_N,(pGVar10->super_Gemm).constant_TILE_K,&TILE_N
                 ,&TILE_K,(int *)&B_int8_scale,iVar14);
      local_80 = (ulong)_TILE_N & 0xffffffff;
      local_88 = (iVar21 + TILE_N + -1) / TILE_N;
      local_1e8.cstep = 0;
      local_1e8.data = (void *)0x0;
      local_1e8.refcount._0_4_ = 0;
      local_1e8.refcount._4_4_ = 0;
      local_1e8.elemsize._0_4_ = 0;
      local_1e8.elemsize._4_4_ = 0;
      local_1e8.elempack = 0;
      local_1e8.allocator = (Allocator *)0x0;
      local_1e8.dims = 0;
      local_1e8.w = 0;
      local_1e8.h = 0;
      local_1e8.d = 0;
      local_1e8.c = 0;
      Mat::create(&local_1e8,iVar21,4,opt->workspace_allocator);
      iVar27 = -100;
      if ((local_1e8.data != (void *)0x0) && ((long)local_1e8.c * local_1e8.cstep != 0)) {
        local_198.cstep = 0;
        local_198.data = (void *)0x0;
        local_198.refcount._0_4_ = 0;
        local_198.refcount._4_4_ = 0;
        local_198.elemsize._0_4_ = 0;
        local_198.elemsize._4_4_ = 0;
        local_198.elempack = 0;
        local_198.allocator = (Allocator *)0x0;
        local_198.dims = 0;
        local_198.w = 0;
        local_198.h = 0;
        local_198.d = 0;
        local_198.c = 0;
        Mat::create(&local_198,iVar21,4,opt->workspace_allocator);
        iVar27 = -100;
        if ((local_198.data != (void *)0x0) && ((long)local_198.c * local_198.cstep != 0)) {
          m_3.cstep = 0;
          m_3.data = (void *)0x0;
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = 0;
          m_3.elemsize._4_4_ = 0;
          m_3.elempack = 0;
          m_3.allocator = (Allocator *)0x0;
          m_3.dims = 0;
          m_3.w = 0;
          m_3.h = 0;
          m_3.d = 0;
          m_3.c = 0;
          if ((int)B_int8_scale < 4) {
LAB_004feda2:
            Mat::create(&m_3,(int)B_int8_scale * (int)local_80,
                        (iVar12 + (int)B_int8_scale + -1) / (int)B_int8_scale,iVar14,1,
                        opt->workspace_allocator);
          }
          else {
            iVar27 = cpu_support_x86_avx512_vnni();
            bVar33 = true;
            if (iVar27 == 0) {
              iVar27 = cpu_support_x86_avx_vnni();
              bVar33 = iVar27 != 0;
            }
            iVar27 = cpu_support_x86_avx_vnni_int8();
            if (!(bool)(bVar33 & iVar27 == 0)) goto LAB_004feda2;
            iVar21 = 0x40;
            iVar27 = (int)local_80;
            if (((iVar27 < 0x10) && (iVar21 = 0x20, iVar27 < 8)) && (iVar21 = 0x10, iVar27 < 4)) {
              iVar21 = (uint)(1 < iVar27) * 4 + 4;
            }
            Mat::create(&m_3,(iVar21 + (int)B_int8_scale) * iVar27,
                        (iVar12 + (int)B_int8_scale + -1) / (int)B_int8_scale,iVar14,1,
                        opt->workspace_allocator);
          }
          iVar27 = -100;
          if ((m_3.data != (void *)0x0) && ((long)m_3.c * m_3.cstep != 0)) {
            local_2f8 = CONCAT44(local_2f8._4_4_,TILE_K);
            m.cstep = 0;
            m.data = (void *)0x0;
            m.refcount._0_4_ = 0;
            m.refcount._4_4_ = 0;
            m.elemsize._0_4_ = 0;
            m.elemsize._4_4_ = 0;
            m.elempack = 0;
            m.allocator = (Allocator *)0x0;
            m.dims = 0;
            m.w = 0;
            m.h = 0;
            m.d = 0;
            m.c = 0;
            Mat::create(&m,TILE_K * (int)local_80,1,iVar14,4,opt->workspace_allocator);
            iVar27 = -100;
            if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) {
              if (local_88 < 1) {
                iVar27 = 0;
              }
              else {
                iVar14 = 0;
                iVar27 = (int)local_2f8;
                do {
                  if ((int)local_2e0 == 0) {
                    iVar12 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
                    fVar22 = (float)A->w;
                  }
                  else {
                    iVar12 = A->w;
                    fVar22 = (float)(A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2]);
                  }
                  iVar28 = (int)local_80;
                  iVar13 = iVar14 * iVar28;
                  iVar21 = iVar12 - iVar13;
                  if (iVar28 < iVar12 - iVar13) {
                    iVar21 = iVar28;
                  }
                  iVar12 = get_omp_thread_num();
                  uVar19 = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                  m_1.data = (void *)((long)iVar12 * m.cstep * uVar19 + (long)m.data);
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ = (undefined4)m.elemsize;
                  m_1.elemsize._4_4_ = m.elemsize._4_4_;
                  m_1.elempack = m.elempack;
                  m_1.allocator = m.allocator;
                  m_1.w = m.w;
                  m_1.h = m.h;
                  m_1.d = 1;
                  m_1.c = m.d;
                  m_1.dims = m.dims + -1;
                  m_1.cstep = (uVar19 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar19;
                  if (m.dims == 4) {
                    m_1.cstep = (long)m.h * (long)m.w;
                  }
                  if (0 < iVar17) {
                    iVar12 = 0;
                    do {
                      iVar28 = iVar17 - iVar12;
                      if (iVar27 < iVar17 - iVar12) {
                        iVar28 = iVar27;
                      }
                      if (0 < (int)fVar22) {
                        iVar27 = 0;
                        fVar29 = fVar22;
                        do {
                          max_kk_00 = fVar29;
                          if ((int)B_int8_scale < (int)fVar29) {
                            max_kk_00 = B_int8_scale;
                          }
                          iVar16 = get_omp_thread_num();
                          m_2.cstep = (size_t)m_3.w;
                          m_2.data = (void *)((long)m_3.data +
                                             CONCAT44(m_3.elemsize._4_4_,(undefined4)m_3.elemsize) *
                                             m_2.cstep * (long)(iVar27 / (int)B_int8_scale) +
                                             (long)iVar16 * m_3.cstep *
                                             CONCAT44(m_3.elemsize._4_4_,(undefined4)m_3.elemsize));
                          m_2.refcount._0_4_ = 0;
                          m_2.refcount._4_4_ = 0;
                          m_2.elemsize._0_4_ = (undefined4)m_3.elemsize;
                          m_2.elemsize._4_4_ = m_3.elemsize._4_4_;
                          m_2.elempack = m_3.elempack;
                          m_2.allocator = m_3.allocator;
                          m_2.w = m_3.w;
                          m_2.dims = 2;
                          m_2.h = 1;
                          m_2.d = 1;
                          m_2.c = 1;
                          local_b0._4_4_ = (local_350->BT_data).w;
                          local_98 = (size_t)local_b0._4_4_;
                          sVar18 = (local_350->BT_data).elemsize;
                          _TILE_M = (void *)((long)(local_350->BT_data).data +
                                            local_98 * sVar18 * (long)(iVar27 / (int)B_int8_scale) +
                                            (long)(iVar12 / (int)local_2f8) *
                                            (local_350->BT_data).cstep * sVar18);
                          local_c0 = (local_350->BT_data).elempack;
                          local_b8 = (local_350->BT_data).allocator;
                          uStack_d0 = 0;
                          uStack_cc = 0;
                          local_c8 = (undefined4)sVar18;
                          uStack_c4 = (undefined4)(sVar18 >> 0x20);
                          local_b0._0_4_ = 2;
                          uStack_a8._0_4_ = 1;
                          uStack_a8._4_4_ = 1;
                          local_a0 = 1;
                          if (iVar12 == 0) {
                            if (iVar27 == 0) {
                              if ((int)local_2e0 == 0) {
                                compute_A_tile_int8_scales
                                          (A,&local_1e8,fVar1,&local_198,iVar13,iVar21);
                              }
                              else {
                                transpose_compute_A_tile_int8_scales
                                          (A,&local_1e8,fVar1,&local_198,iVar13,iVar21);
                              }
                            }
                            if ((int)local_2e0 == 0) {
                              pack_A_tile_quantize
                                        (A,&m_2,iVar13,iVar21,iVar27,(int)max_kk_00,&local_1e8);
                            }
                            else {
                              transpose_pack_A_tile_quantize
                                        (A,&m_2,iVar13,iVar21,iVar27,(int)max_kk_00,&local_1e8);
                            }
                          }
                          gemm_transB_packed_tile_int8
                                    (&m_2,(Mat *)&TILE_M,&m_1,iVar13,iVar21,iVar12,iVar28,iVar27,
                                     (int)max_kk_00);
                          piVar32 = (int *)CONCAT44(uStack_cc,uStack_d0);
                          if (piVar32 != (int *)0x0) {
                            LOCK();
                            *piVar32 = *piVar32 + -1;
                            UNLOCK();
                            if (*piVar32 == 0) {
                              if (local_b8 == (Allocator *)0x0) {
                                if (_TILE_M != (void *)0x0) {
                                  free(_TILE_M);
                                }
                              }
                              else {
                                (*local_b8->_vptr_Allocator[3])();
                              }
                            }
                          }
                          local_98 = 0;
                          _TILE_M = (void *)0x0;
                          uStack_d0 = 0;
                          uStack_cc = 0;
                          local_c8 = 0;
                          uStack_c4 = 0;
                          local_c0 = 0;
                          local_b0._0_4_ = 0;
                          local_b0._4_4_ = 0;
                          uStack_a8._0_4_ = 0;
                          uStack_a8._4_4_ = 0;
                          local_a0 = 0;
                          piVar32 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
                          if (piVar32 != (int *)0x0) {
                            LOCK();
                            *piVar32 = *piVar32 + -1;
                            UNLOCK();
                            if (*piVar32 == 0) {
                              if (m_2.allocator == (Allocator *)0x0) {
                                if (m_2.data != (void *)0x0) {
                                  free(m_2.data);
                                }
                              }
                              else {
                                (*(m_2.allocator)->_vptr_Allocator[3])();
                              }
                            }
                          }
                          m_2.cstep = 0;
                          m_2.data = (void *)0x0;
                          m_2.refcount._0_4_ = 0;
                          m_2.refcount._4_4_ = 0;
                          m_2.elemsize._0_4_ = 0;
                          m_2.elemsize._4_4_ = 0;
                          m_2.elempack = 0;
                          m_2.dims = 0;
                          m_2.w = 0;
                          m_2.h = 0;
                          m_2.d = 0;
                          m_2.c = 0;
                          iVar27 = iVar27 + (int)B_int8_scale;
                          fVar29 = (float)((int)fVar29 - (int)B_int8_scale);
                        } while (iVar27 < (int)fVar22);
                      }
                      unpack_output_tile_dequantize
                                (&m_1,&local_348,this_00,broadcast_type_C,iVar13,iVar21,iVar12,
                                 iVar28,&local_198,fVar2,fVar15,iVar25);
                      iVar12 = iVar12 + (int)local_2f8;
                      iVar27 = (int)local_2f8;
                    } while (iVar12 < iVar17);
                  }
                  piVar32 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                  if (piVar32 != (int *)0x0) {
                    LOCK();
                    *piVar32 = *piVar32 + -1;
                    UNLOCK();
                    if (*piVar32 == 0) {
                      if (m_1.allocator == (Allocator *)0x0) {
                        if (m_1.data != (void *)0x0) {
                          free(m_1.data);
                        }
                      }
                      else {
                        (*(m_1.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  m_1.cstep = 0;
                  m_1.data = (void *)0x0;
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ = 0;
                  m_1.elemsize._4_4_ = 0;
                  m_1.elempack = 0;
                  m_1.dims = 0;
                  m_1.w = 0;
                  m_1.h = 0;
                  m_1.d = 0;
                  m_1.c = 0;
                  iVar14 = iVar14 + 1;
                } while (iVar14 != local_88);
                iVar27 = 0;
              }
            }
            piVar32 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
            if (piVar32 != (int *)0x0) {
              LOCK();
              *piVar32 = *piVar32 + -1;
              UNLOCK();
              if (*piVar32 == 0) {
                if (m.allocator == (Allocator *)0x0) {
                  if (m.data != (void *)0x0) {
                    free(m.data);
                  }
                }
                else {
                  (*(m.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m.cstep = 0;
            m.data = (void *)0x0;
            m.refcount._0_4_ = 0;
            m.refcount._4_4_ = 0;
            m.elemsize._0_4_ = 0;
            m.elemsize._4_4_ = 0;
            m.elempack = 0;
            m.dims = 0;
            m.w = 0;
            m.h = 0;
            m.d = 0;
            m.c = 0;
          }
          piVar32 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
          if (piVar32 != (int *)0x0) {
            LOCK();
            *piVar32 = *piVar32 + -1;
            UNLOCK();
            if (*piVar32 == 0) {
              if (m_3.allocator == (Allocator *)0x0) {
                if (m_3.data != (void *)0x0) {
                  free(m_3.data);
                }
              }
              else {
                (*(m_3.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m_3.cstep = 0;
          m_3.data = (void *)0x0;
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = 0;
          m_3.elemsize._4_4_ = 0;
          m_3.elempack = 0;
          m_3.dims = 0;
          m_3.w = 0;
          m_3.h = 0;
          m_3.d = 0;
          m_3.c = 0;
        }
        piVar32 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + -1;
          UNLOCK();
          if (*piVar32 == 0) {
            if (local_198.allocator == (Allocator *)0x0) {
              if (local_198.data != (void *)0x0) {
                free(local_198.data);
              }
            }
            else {
              (*(local_198.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_198.cstep = 0;
        local_198.data = (void *)0x0;
        local_198.refcount._0_4_ = 0;
        local_198.refcount._4_4_ = 0;
        local_198.elemsize._0_4_ = 0;
        local_198.elemsize._4_4_ = 0;
        local_198.elempack = 0;
        local_198.dims = 0;
        local_198.w = 0;
        local_198.h = 0;
        local_198.d = 0;
        local_198.c = 0;
      }
      piVar32 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
      if (piVar32 != (int *)0x0) {
        LOCK();
        *piVar32 = *piVar32 + -1;
        UNLOCK();
        if (*piVar32 == 0) {
          if (local_1e8.allocator == (Allocator *)0x0) {
            if (local_1e8.data != (void *)0x0) {
              free(local_1e8.data);
            }
          }
          else {
            (*(local_1e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_1e8.cstep = 0;
      local_1e8.data = (void *)0x0;
      local_1e8.refcount._0_4_ = 0;
      local_1e8.refcount._4_4_ = 0;
      local_1e8.elemsize._0_4_ = 0;
      local_1e8.elemsize._4_4_ = 0;
      local_1e8.elempack = 0;
      local_1e8.dims = 0;
      local_1e8.w = 0;
      local_1e8.h = 0;
      local_1e8.d = 0;
      local_1e8.c = 0;
      goto LAB_004ffcc6;
    }
    iVar27 = (pGVar10->super_Gemm).transA;
    local_2f8 = CONCAT44(local_2f8._4_4_,iVar27);
    if (iVar27 == 0) {
      iVar17 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
    }
    else {
      iVar17 = A->w;
    }
    iVar12 = (pGVar10->super_Gemm).transB;
    if (iVar27 == 0) {
      iVar21 = A->w;
    }
    else {
      iVar21 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
    }
    local_350 = (Gemm_x86_fma *)CONCAT44(local_350._4_4_,iVar12);
    if (iVar12 == 0) {
      uVar31 = A[1].w;
    }
    else {
      uVar31 = A[1].elempack * (&A[1].h)[(ulong)(A[1].dims == 3) * 2];
    }
    iVar12 = (pGVar10->super_Gemm).output_transpose;
    fVar1 = (pGVar10->super_Gemm).alpha;
    fVar2 = (pGVar10->super_Gemm).beta;
    get_optimal_tile_mnk_int8
              (iVar17,uVar31,iVar21,(pGVar10->super_Gemm).constant_TILE_M,
               (pGVar10->super_Gemm).constant_TILE_N,(pGVar10->super_Gemm).constant_TILE_K,&TILE_K,
               (int *)&B_int8_scale,&TILE_K_2,iVar14);
    iVar25 = TILE_K_2;
    iVar27 = TILE_K;
    fVar15 = B_int8_scale;
    iVar28 = (iVar17 + TILE_K + -1) / TILE_K;
    iVar13 = (int)(uVar31 + (int)B_int8_scale + -1) / (int)B_int8_scale;
    iVar16 = (TILE_K_2 + iVar21 + -1) / TILE_K_2;
    local_1e8.cstep = 0;
    local_1e8.data = (void *)0x0;
    local_1e8.refcount._0_4_ = 0;
    local_1e8.refcount._4_4_ = 0;
    local_1e8.elemsize._0_4_ = 0;
    local_1e8.elemsize._4_4_ = 0;
    local_1e8.elempack = 0;
    local_1e8.allocator = (Allocator *)0x0;
    local_1e8.dims = 0;
    local_1e8.w = 0;
    local_1e8.h = 0;
    local_1e8.d = 0;
    local_1e8.c = 0;
    local_2e0 = (ulong)uVar31;
    if (TILE_K_2 < 4) {
LAB_004fe30e:
      Mat::create(&local_1e8,iVar27 * iVar25,iVar16,iVar14,1,opt->workspace_allocator);
    }
    else {
      iVar24 = cpu_support_x86_avx512_vnni();
      bVar33 = true;
      if (iVar24 == 0) {
        iVar24 = cpu_support_x86_avx_vnni();
        bVar33 = iVar24 != 0;
      }
      iVar24 = cpu_support_x86_avx_vnni_int8();
      if (!(bool)(bVar33 & iVar24 == 0)) goto LAB_004fe30e;
      iVar24 = 0x40;
      if (((iVar27 < 0x10) && (iVar24 = 0x20, iVar27 < 8)) && (iVar24 = 0x10, iVar27 < 4)) {
        iVar24 = (uint)(1 < iVar27) * 4 + 4;
      }
      Mat::create(&local_1e8,(iVar24 + iVar25) * iVar27,iVar16,iVar14,1,opt->workspace_allocator);
    }
    iVar27 = -100;
    if ((local_1e8.data != (void *)0x0) && ((long)local_1e8.c * local_1e8.cstep != 0)) {
      local_198.cstep = 0;
      local_198.data = (void *)0x0;
      local_198.refcount._0_4_ = 0;
      local_198.refcount._4_4_ = 0;
      local_198.elemsize._0_4_ = 0;
      local_198.elemsize._4_4_ = 0;
      local_198.elempack = 0;
      local_198.allocator = (Allocator *)0x0;
      local_198.dims = 0;
      local_198.w = 0;
      local_198.h = 0;
      local_198.d = 0;
      local_198.c = 0;
      Mat::create(&local_198,iVar25 * (int)fVar15,iVar16,iVar13,1,opt->workspace_allocator);
      iVar27 = -100;
      if ((local_198.data != (void *)0x0) && ((long)local_198.c * local_198.cstep != 0)) {
        m_3.cstep = 0;
        m_3.data = (void *)0x0;
        m_3.refcount._0_4_ = 0;
        m_3.refcount._4_4_ = 0;
        m_3.elemsize._0_4_ = 0;
        m_3.elemsize._4_4_ = 0;
        m_3.elempack = 0;
        m_3.allocator = (Allocator *)0x0;
        m_3.dims = 0;
        m_3.w = 0;
        m_3.h = 0;
        m_3.d = 0;
        m_3.c = 0;
        Mat::create(&m_3,iVar17,4,opt->workspace_allocator);
        iVar27 = -100;
        if ((m_3.data != (void *)0x0) && ((long)m_3.c * m_3.cstep != 0)) {
          B = A + 1;
          compute_B_int8_scale(B,&B_int8_scale_1);
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.allocator = (Allocator *)0x0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          Mat::create(&m,iVar17,4,opt->workspace_allocator);
          iVar27 = -100;
          if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) {
            iVar13 = iVar16 * iVar13;
            if (0 < iVar13) {
              iVar27 = 0;
              do {
                iVar17 = (int)B_int8_scale * (iVar27 / iVar16);
                iVar25 = TILE_K_2 * (int)((long)iVar27 % (long)iVar16);
                fVar15 = (float)((int)local_2e0 - iVar17);
                if ((int)B_int8_scale < (int)fVar15) {
                  fVar15 = B_int8_scale;
                }
                iVar24 = iVar21 - iVar25;
                if (TILE_K_2 < iVar21 - iVar25) {
                  iVar24 = TILE_K_2;
                }
                m_1.cstep = (size_t)local_198.w;
                m_1.data = (void *)((long)local_198.data +
                                   ((long)iVar27 % (long)iVar16 & 0xffffffffU) * m_1.cstep *
                                   CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize)
                                   + (long)(iVar27 / iVar16) * local_198.cstep *
                                     CONCAT44(local_198.elemsize._4_4_,
                                              (undefined4)local_198.elemsize));
                m_1.refcount._0_4_ = 0;
                m_1.refcount._4_4_ = 0;
                m_1.elemsize._0_4_ = (undefined4)local_198.elemsize;
                m_1.elemsize._4_4_ = local_198.elemsize._4_4_;
                m_1.elempack = local_198.elempack;
                m_1.allocator = local_198.allocator;
                m_1.dims = 2;
                m_1.w = local_198.w;
                m_1.h = 1;
                m_1.d = 1;
                m_1.c = 1;
                if ((int)local_350 == 0) {
                  transpose_pack_B_tile_quantize
                            (B,&m_1,iVar17,(int)fVar15,iVar25,iVar24,B_int8_scale_1);
                }
                else {
                  pack_B_tile_quantize(B,&m_1,iVar17,(int)fVar15,iVar25,iVar24,B_int8_scale_1);
                }
                piVar32 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                if (piVar32 != (int *)0x0) {
                  LOCK();
                  *piVar32 = *piVar32 + -1;
                  UNLOCK();
                  if (*piVar32 == 0) {
                    if (m_1.allocator == (Allocator *)0x0) {
                      if (m_1.data != (void *)0x0) {
                        free(m_1.data);
                      }
                    }
                    else {
                      (*(m_1.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                iVar27 = iVar27 + 1;
              } while (iVar13 != iVar27);
            }
            m_1.cstep = 0;
            m_1.data = (void *)0x0;
            m_1.refcount._0_4_ = 0;
            m_1.refcount._4_4_ = 0;
            m_1.elemsize._0_4_ = 0;
            m_1.elemsize._4_4_ = 0;
            m_1.elempack = 0;
            m_1.allocator = (Allocator *)0x0;
            m_1.dims = 0;
            m_1.w = 0;
            m_1.h = 0;
            m_1.d = 0;
            m_1.c = 0;
            Mat::create(&m_1,TILE_K * (int)B_int8_scale,1,iVar14,4,opt->workspace_allocator);
            iVar27 = -100;
            if ((m_1.data != (void *)0x0) && ((long)m_1.c * m_1.cstep != 0)) {
              if (iVar28 < 1) {
                iVar27 = 0;
              }
              else {
                iVar27 = 0;
                uVar19 = local_2e0;
                do {
                  if ((int)local_2f8 == 0) {
                    iVar14 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
                    iVar17 = A->w;
                  }
                  else {
                    iVar14 = A->w;
                    iVar17 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
                  }
                  iVar25 = iVar27 * TILE_K;
                  iVar21 = iVar14 - iVar25;
                  if (TILE_K < iVar14 - iVar25) {
                    iVar21 = TILE_K;
                  }
                  local_350 = (Gemm_x86_fma *)CONCAT44(local_350._4_4_,iVar21);
                  iVar14 = get_omp_thread_num();
                  uVar30 = CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize);
                  m_2.data = (void *)((long)iVar14 * m_1.cstep * uVar30 + (long)m_1.data);
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = (undefined4)m_1.elemsize;
                  m_2.elemsize._4_4_ = m_1.elemsize._4_4_;
                  m_2.elempack = m_1.elempack;
                  m_2.allocator = m_1.allocator;
                  m_2.d = 1;
                  m_2.h = m_1.h;
                  m_2.c = m_1.d;
                  m_2.w = m_1.w;
                  m_2.dims = m_1.dims + -1;
                  m_2.cstep = (uVar30 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) /
                              uVar30;
                  if (m_1.dims == 4) {
                    m_2.cstep = (long)m_1.h * (long)m_1.w;
                  }
                  if (0 < (int)uVar19) {
                    iVar14 = 0;
                    do {
                      fVar15 = (float)((int)uVar19 - iVar14);
                      if ((int)B_int8_scale < (int)fVar15) {
                        fVar15 = B_int8_scale;
                      }
                      if (0 < iVar17) {
                        iVar13 = 0;
                        iVar21 = iVar17;
                        do {
                          iVar16 = iVar21;
                          if (TILE_K_2 < iVar21) {
                            iVar16 = TILE_K_2;
                          }
                          iVar24 = get_omp_thread_num();
                          local_98 = (size_t)local_1e8.w;
                          _TILE_M = (void *)((long)local_1e8.data +
                                            CONCAT44(local_1e8.elemsize._4_4_,
                                                     (undefined4)local_1e8.elemsize) * local_98 *
                                            (long)(iVar13 / TILE_K_2) +
                                            (long)iVar24 * local_1e8.cstep *
                                            CONCAT44(local_1e8.elemsize._4_4_,
                                                     (undefined4)local_1e8.elemsize));
                          local_38 = (size_t)local_198.w;
                          _TILE_N = (void *)((long)local_198.data +
                                            local_38 *
                                            CONCAT44(local_198.elemsize._4_4_,
                                                     (undefined4)local_198.elemsize) *
                                            (long)(iVar13 / TILE_K_2) +
                                            (long)(iVar14 / (int)B_int8_scale) * local_198.cstep *
                                            CONCAT44(local_198.elemsize._4_4_,
                                                     (undefined4)local_198.elemsize));
                          uStack_d0 = 0;
                          uStack_cc = 0;
                          local_c8 = (undefined4)local_1e8.elemsize;
                          uStack_c4 = local_1e8.elemsize._4_4_;
                          local_c0 = local_1e8.elempack;
                          local_b8 = local_1e8.allocator;
                          local_b0._4_4_ = local_1e8.w;
                          local_b0._0_4_ = 2;
                          uStack_a8._0_4_ = 1;
                          uStack_a8._4_4_ = 1;
                          local_a0 = 1;
                          uStack_70 = 0;
                          uStack_6c = 0;
                          local_68 = (undefined4)local_198.elemsize;
                          uStack_64 = local_198.elemsize._4_4_;
                          local_60 = local_198.elempack;
                          local_58 = local_198.allocator;
                          local_50._4_4_ = local_198.w;
                          local_50._0_4_ = 2;
                          uStack_48._0_4_ = 1;
                          uStack_48._4_4_ = 1;
                          local_40 = 1;
                          if (iVar14 == 0) {
                            if (iVar13 == 0) {
                              if ((int)local_2f8 == 0) {
                                compute_A_tile_int8_scales
                                          (A,&m_3,B_int8_scale_1,&m,iVar25,(int)local_350);
                              }
                              else {
                                transpose_compute_A_tile_int8_scales
                                          (A,&m_3,B_int8_scale_1,&m,iVar25,(int)local_350);
                              }
                            }
                            if ((int)local_2f8 == 0) {
                              pack_A_tile_quantize
                                        (A,(Mat *)&TILE_M,iVar25,(int)local_350,iVar13,iVar16,&m_3);
                            }
                            else {
                              transpose_pack_A_tile_quantize
                                        (A,(Mat *)&TILE_M,iVar25,(int)local_350,iVar13,iVar16,&m_3);
                            }
                          }
                          gemm_transB_packed_tile_int8
                                    ((Mat *)&TILE_M,(Mat *)&TILE_N,&m_2,iVar25,(int)local_350,iVar14
                                     ,(int)fVar15,iVar13,iVar16);
                          piVar32 = (int *)CONCAT44(uStack_6c,uStack_70);
                          if (piVar32 != (int *)0x0) {
                            LOCK();
                            *piVar32 = *piVar32 + -1;
                            UNLOCK();
                            if (*piVar32 == 0) {
                              if (local_58 == (Allocator *)0x0) {
                                if (_TILE_N != (void *)0x0) {
                                  free(_TILE_N);
                                }
                              }
                              else {
                                (*local_58->_vptr_Allocator[3])();
                              }
                            }
                          }
                          local_38 = 0;
                          _TILE_N = (void *)0x0;
                          uStack_70 = 0;
                          uStack_6c = 0;
                          local_68 = 0;
                          uStack_64 = 0;
                          local_60 = 0;
                          local_50._0_4_ = 0;
                          local_50._4_4_ = 0;
                          uStack_48._0_4_ = 0;
                          uStack_48._4_4_ = 0;
                          local_40 = 0;
                          piVar32 = (int *)CONCAT44(uStack_cc,uStack_d0);
                          if (piVar32 != (int *)0x0) {
                            LOCK();
                            *piVar32 = *piVar32 + -1;
                            UNLOCK();
                            if (*piVar32 == 0) {
                              if (local_b8 == (Allocator *)0x0) {
                                if (_TILE_M != (void *)0x0) {
                                  free(_TILE_M);
                                }
                              }
                              else {
                                (*local_b8->_vptr_Allocator[3])();
                              }
                            }
                          }
                          local_98 = 0;
                          _TILE_M = (void *)0x0;
                          uStack_d0 = 0;
                          uStack_cc = 0;
                          local_c8 = 0;
                          uStack_c4 = 0;
                          local_c0 = 0;
                          local_b0._0_4_ = 0;
                          local_b0._4_4_ = 0;
                          uStack_a8._0_4_ = 0;
                          uStack_a8._4_4_ = 0;
                          local_a0 = 0;
                          iVar13 = iVar13 + TILE_K_2;
                          iVar21 = iVar21 - TILE_K_2;
                        } while (iVar13 < iVar17);
                      }
                      unpack_output_tile_dequantize
                                (&m_2,&local_348,this_00,broadcast_type_C,iVar25,(int)local_350,
                                 iVar14,(int)fVar15,&m,fVar1,fVar2,iVar12);
                      iVar14 = iVar14 + (int)B_int8_scale;
                      uVar19 = local_2e0;
                    } while (iVar14 < (int)local_2e0);
                  }
                  piVar32 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
                  if (piVar32 != (int *)0x0) {
                    LOCK();
                    *piVar32 = *piVar32 + -1;
                    UNLOCK();
                    if (*piVar32 == 0) {
                      if (m_2.allocator == (Allocator *)0x0) {
                        if (m_2.data != (void *)0x0) {
                          free(m_2.data);
                        }
                      }
                      else {
                        (*(m_2.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  m_2.cstep = 0;
                  m_2.data = (void *)0x0;
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = 0;
                  m_2.elemsize._4_4_ = 0;
                  m_2.elempack = 0;
                  m_2.dims = 0;
                  m_2.w = 0;
                  m_2.h = 0;
                  m_2.d = 0;
                  m_2.c = 0;
                  iVar27 = iVar27 + 1;
                } while (iVar27 != iVar28);
                iVar27 = 0;
              }
            }
            piVar32 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
            if (piVar32 != (int *)0x0) {
              LOCK();
              *piVar32 = *piVar32 + -1;
              UNLOCK();
              if (*piVar32 == 0) {
                if (m_1.allocator == (Allocator *)0x0) {
                  if (m_1.data != (void *)0x0) {
                    free(m_1.data);
                  }
                }
                else {
                  (*(m_1.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_1.cstep = 0;
            m_1.data = (void *)0x0;
            m_1.refcount._0_4_ = 0;
            m_1.refcount._4_4_ = 0;
            m_1.elemsize._0_4_ = 0;
            m_1.elemsize._4_4_ = 0;
            m_1.elempack = 0;
            m_1.dims = 0;
            m_1.w = 0;
            m_1.h = 0;
            m_1.d = 0;
            m_1.c = 0;
          }
          piVar32 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar32 != (int *)0x0) {
            LOCK();
            *piVar32 = *piVar32 + -1;
            UNLOCK();
            if (*piVar32 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
        }
        piVar32 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + -1;
          UNLOCK();
          if (*piVar32 == 0) {
            if (m_3.allocator == (Allocator *)0x0) {
              if (m_3.data != (void *)0x0) {
                free(m_3.data);
              }
            }
            else {
              (*(m_3.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        m_3.cstep = 0;
        m_3.data = (void *)0x0;
        m_3.refcount._0_4_ = 0;
        m_3.refcount._4_4_ = 0;
        m_3.elemsize._0_4_ = 0;
        m_3.elemsize._4_4_ = 0;
        m_3.elempack = 0;
        m_3.dims = 0;
        m_3.w = 0;
        m_3.h = 0;
        m_3.d = 0;
        m_3.c = 0;
      }
      piVar32 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
      if (piVar32 != (int *)0x0) {
        LOCK();
        *piVar32 = *piVar32 + -1;
        UNLOCK();
        if (*piVar32 == 0) {
          if (local_198.allocator == (Allocator *)0x0) {
            if (local_198.data != (void *)0x0) {
              free(local_198.data);
            }
          }
          else {
            (*(local_198.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_198.cstep = 0;
      local_198.data = (void *)0x0;
      local_198.refcount._0_4_ = 0;
      local_198.refcount._4_4_ = 0;
      local_198.elemsize._0_4_ = 0;
      local_198.elemsize._4_4_ = 0;
      local_198.elempack = 0;
      local_198.dims = 0;
      local_198.w = 0;
      local_198.h = 0;
      local_198.d = 0;
      local_198.c = 0;
    }
    piVar32 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
    if (piVar32 != (int *)0x0) {
      LOCK();
      *piVar32 = *piVar32 + -1;
      UNLOCK();
      if (*piVar32 == 0) {
        if (local_1e8.allocator == (Allocator *)0x0) {
joined_r0x004fed85:
          if (local_1e8.data != (void *)0x0) {
            free(local_1e8.data);
          }
        }
        else {
          (*(local_1e8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    fVar1 = (pGVar10->super_Gemm).B_data_int8_scale;
    uVar31 = (pGVar10->super_Gemm).constantM;
    iVar27 = (pGVar10->super_Gemm).constantN;
    iVar17 = (pGVar10->super_Gemm).constantK;
    iVar12 = (pGVar10->super_Gemm).output_transpose;
    fVar2 = (pGVar10->super_Gemm).alpha;
    fVar15 = (pGVar10->super_Gemm).beta;
    local_2e0 = CONCAT44(local_2e0._4_4_,iVar27);
    get_optimal_tile_mnk_int8
              (uVar31,iVar27,iVar17,(pGVar10->super_Gemm).constant_TILE_M,
               (pGVar10->super_Gemm).constant_TILE_N,(pGVar10->super_Gemm).constant_TILE_K,
               (int *)&m_2,&TILE_M,&TILE_N,iVar14);
    iVar21 = (int)m_2.data;
    uVar19 = (long)(int)(uVar31 + (int)m_2.data + -1) / (long)(int)m_2.data;
    local_1e8.cstep = 0;
    local_1e8.data = (void *)0x0;
    local_1e8.refcount._0_4_ = 0;
    local_1e8.refcount._4_4_ = 0;
    local_1e8.elemsize._0_4_ = 0;
    local_1e8.elemsize._4_4_ = 0;
    local_1e8.elempack = 0;
    local_1e8.allocator = (Allocator *)0x0;
    local_1e8.dims = 0;
    local_1e8.w = 0;
    local_1e8.h = 0;
    local_1e8.d = 0;
    local_1e8.c = 0;
    Mat::create(&local_1e8,uVar31,4,opt->workspace_allocator);
    iVar27 = -100;
    if ((local_1e8.data != (void *)0x0) && ((long)local_1e8.c * local_1e8.cstep != 0)) {
      if (0 < (int)uVar31) {
        pvVar4 = (local_350->super_Gemm).A_data_int8_scales.data;
        uVar30 = 0;
        do {
          *(float *)((long)local_1e8.data + uVar30 * 4) =
               1.0 / (fVar1 * *(float *)((long)pvVar4 + uVar30 * 4));
          uVar30 = uVar30 + 1;
        } while (uVar31 != uVar30);
      }
      iVar25 = TILE_M;
      local_198.cstep = 0;
      local_198.data = (void *)0x0;
      local_198.refcount._0_4_ = 0;
      local_198.refcount._4_4_ = 0;
      local_198.elemsize._0_4_ = 0;
      local_198.elemsize._4_4_ = 0;
      local_198.elempack = 0;
      local_198.allocator = (Allocator *)0x0;
      local_198.dims = 0;
      local_198.w = 0;
      local_198.h = 0;
      local_198.d = 0;
      local_198.c = 0;
      Mat::create(&local_198,TILE_M * iVar21,1,iVar14,4,opt->workspace_allocator);
      iVar27 = -100;
      if ((local_198.data != (void *)0x0) && ((long)local_198.c * local_198.cstep != 0)) {
        if (0 < (int)uVar19) {
          iVar27 = TILE_N;
          uVar30 = 0;
          iVar14 = (int)local_2e0;
          do {
            iVar13 = iVar21 * (int)uVar30;
            iVar28 = uVar31 - iVar13;
            if (iVar21 < (int)(uVar31 - iVar13)) {
              iVar28 = iVar21;
            }
            iVar16 = get_omp_thread_num();
            uVar9 = CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
            m_3.data = (void *)((long)iVar16 * local_198.cstep * uVar9 + (long)local_198.data);
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = (undefined4)local_198.elemsize;
            m_3.elemsize._4_4_ = local_198.elemsize._4_4_;
            m_3.elempack = local_198.elempack;
            m_3.allocator = local_198.allocator;
            m_3.w = local_198.w;
            m_3.h = local_198.h;
            m_3.d = 1;
            m_3.c = local_198.d;
            m_3.dims = local_198.dims + -1;
            m_3.cstep = (uVar9 * (long)local_198.h * (long)local_198.w + 0xf & 0xfffffffffffffff0) /
                        uVar9;
            if (local_198.dims == 4) {
              m_3.cstep = (long)local_198.h * (long)local_198.w;
            }
            if (0 < iVar14) {
              iVar16 = 0;
              do {
                iVar24 = iVar14 - iVar16;
                if (iVar25 < iVar14 - iVar16) {
                  iVar24 = iVar25;
                }
                if (0 < iVar17) {
                  local_2f8 = (long)(iVar16 / iVar25);
                  iVar20 = 0;
                  iVar14 = iVar17;
                  do {
                    max_kk = iVar14;
                    if (iVar27 < iVar14) {
                      max_kk = iVar27;
                    }
                    m.w = (local_350->AT_data).w;
                    m.cstep = (size_t)m.w;
                    sVar18 = (local_350->AT_data).elemsize;
                    m.elempack = (local_350->AT_data).elempack;
                    m.allocator = (local_350->AT_data).allocator;
                    m.data = (void *)((long)(local_350->AT_data).data +
                                     sVar18 * m.cstep * (long)(iVar20 / iVar27) +
                                     (local_350->AT_data).cstep * uVar30 * sVar18);
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = (undefined4)sVar18;
                    m.elemsize._4_4_ = (undefined4)(sVar18 >> 0x20);
                    m.dims = 2;
                    m.h = 1;
                    m.d = 1;
                    m.c = 1;
                    m_1.w = (local_350->BT_data).w;
                    m_1.cstep = (size_t)m_1.w;
                    sVar18 = (local_350->BT_data).elemsize;
                    m_1.elempack = (local_350->BT_data).elempack;
                    m_1.data = (void *)((long)(local_350->BT_data).data +
                                       m_1.cstep * sVar18 * (long)(iVar20 / iVar27) +
                                       (local_350->BT_data).cstep * local_2f8 * sVar18);
                    m_1.allocator = (local_350->BT_data).allocator;
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize._0_4_ = (undefined4)sVar18;
                    m_1.elemsize._4_4_ = (undefined4)(sVar18 >> 0x20);
                    m_1.dims = 2;
                    m_1.h = 1;
                    m_1.d = 1;
                    m_1.c = 1;
                    gemm_transB_packed_tile_int8
                              (&m,&m_1,&m_3,iVar13,iVar28,iVar16,iVar24,iVar20,max_kk);
                    piVar32 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                    if (piVar32 != (int *)0x0) {
                      LOCK();
                      *piVar32 = *piVar32 + -1;
                      UNLOCK();
                      if (*piVar32 == 0) {
                        if (m_1.allocator == (Allocator *)0x0) {
                          if (m_1.data != (void *)0x0) {
                            free(m_1.data);
                          }
                        }
                        else {
                          (*(m_1.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    m_1.cstep = 0;
                    m_1.data = (void *)0x0;
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize._0_4_ = 0;
                    m_1.elemsize._4_4_ = 0;
                    m_1.elempack = 0;
                    m_1.dims = 0;
                    m_1.w = 0;
                    m_1.h = 0;
                    m_1.d = 0;
                    m_1.c = 0;
                    piVar32 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar32 != (int *)0x0) {
                      LOCK();
                      *piVar32 = *piVar32 + -1;
                      UNLOCK();
                      if (*piVar32 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          if (m.data != (void *)0x0) {
                            free(m.data);
                          }
                        }
                        else {
                          (*(m.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    m.cstep = 0;
                    m.data = (void *)0x0;
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = 0;
                    m.elemsize._4_4_ = 0;
                    m.elempack = 0;
                    m.dims = 0;
                    m.w = 0;
                    m.h = 0;
                    m.d = 0;
                    m.c = 0;
                    iVar20 = iVar20 + iVar27;
                    iVar14 = iVar14 - iVar27;
                  } while (iVar20 < iVar17);
                }
                unpack_output_tile_dequantize
                          (&m_3,&local_348,this_00,broadcast_type_C,iVar13,iVar28,iVar16,iVar24,
                           &local_1e8,fVar2,fVar15,iVar12);
                iVar16 = iVar16 + iVar25;
                iVar14 = (int)local_2e0;
              } while (iVar16 < (int)local_2e0);
            }
            piVar32 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
            if (piVar32 != (int *)0x0) {
              LOCK();
              *piVar32 = *piVar32 + -1;
              UNLOCK();
              if (*piVar32 == 0) {
                if (m_3.allocator == (Allocator *)0x0) {
                  if (m_3.data != (void *)0x0) {
                    free(m_3.data);
                  }
                }
                else {
                  (*(m_3.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_3.cstep = 0;
            m_3.data = (void *)0x0;
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = 0;
            m_3.elemsize._4_4_ = 0;
            m_3.elempack = 0;
            m_3.dims = 0;
            m_3.w = 0;
            m_3.h = 0;
            m_3.d = 0;
            m_3.c = 0;
            uVar30 = uVar30 + 1;
          } while (uVar30 != (uVar19 & 0xffffffff));
        }
        iVar27 = 0;
      }
      piVar32 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
      if (piVar32 != (int *)0x0) {
        LOCK();
        *piVar32 = *piVar32 + -1;
        UNLOCK();
        if (*piVar32 == 0) {
          if (local_198.allocator == (Allocator *)0x0) {
            if (local_198.data != (void *)0x0) {
              free(local_198.data);
            }
          }
          else {
            (*(local_198.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_198.cstep = 0;
      local_198.data = (void *)0x0;
      local_198.refcount._0_4_ = 0;
      local_198.refcount._4_4_ = 0;
      local_198.elemsize._0_4_ = 0;
      local_198.elemsize._4_4_ = 0;
      local_198.elempack = 0;
      local_198.dims = 0;
      local_198.w = 0;
      local_198.h = 0;
      local_198.d = 0;
      local_198.c = 0;
    }
    piVar32 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
    if (piVar32 != (int *)0x0) {
      LOCK();
      *piVar32 = *piVar32 + -1;
      UNLOCK();
      if (*piVar32 == 0) {
        if (local_1e8.allocator == (Allocator *)0x0) goto joined_r0x004fed85;
        (*(local_1e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_1e8.cstep = 0;
  local_1e8.data = (void *)0x0;
  local_1e8.refcount._0_4_ = 0;
  local_1e8.refcount._4_4_ = 0;
  local_1e8.elemsize._0_4_ = 0;
  local_1e8.elemsize._4_4_ = 0;
  local_1e8.elempack = 0;
  local_1e8.dims = 0;
  local_1e8.w = 0;
  local_1e8.h = 0;
  local_1e8.d = 0;
  local_1e8.c = 0;
LAB_004ffcc6:
  piVar32 = (int *)CONCAT44(local_348.refcount._4_4_,local_348.refcount._0_4_);
  if (piVar32 != (int *)0x0) {
    LOCK();
    *piVar32 = *piVar32 + -1;
    UNLOCK();
    if (*piVar32 == 0) {
      if (local_348.allocator == (Allocator *)0x0) {
        if (local_348.data != (void *)0x0) {
          free(local_348.data);
        }
      }
      else {
        (*(local_348.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar27;
}

Assistant:

int Gemm_x86_fma::forward_int8(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int M;
    int N;
    if (constantA && constantB)
    {
        M = constantM;
        N = constantN;
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        M = constantM;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = constantN;
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = CT_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            C = bottom_blobs.size() == 1 ? bottom_blobs[0] : Mat();
        }
        else if (constantA)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else if (constantB)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else
        {
            C = bottom_blobs.size() == 3 ? bottom_blobs[2] : Mat();
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w * C.elempack == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w * C.elempack == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h * C.elempack == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }
        }
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        int outh = output_transpose ? N : M;
#if __AVX512F__
        out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
        out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // FIXME use output_elempack
    // int output_elempack = out_elempack > 4 ? 4 : out_elempack;

    if (output_elempack)
        out_elempack = output_elempack;
    size_t out_elemsize = 4u * out_elempack;

    // FIXME use output_elemtype instead of input_elemtype
    // int output_elemtype = input_elemtype;

    // TODO use output_elemtype

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(M, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(N, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (constantA && constantB)
    {
        ret = gemm_AT_BT_x86_int8(AT_data, A_data_int8_scales, BT_data, B_data_int8_scale, C, top_blob, broadcast_type_C, constantM, constantN, constantK, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        ret = gemm_AT_x86_int8(AT_data, A_data_int8_scales, B, C, top_blob, broadcast_type_C, constantM, constantK, transB, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        ret = gemm_BT_x86_int8(A, BT_data, B_data_int8_scale, C, top_blob, broadcast_type_C, constantN, constantK, transA, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        ret = gemm_x86_int8(A, B, C, top_blob, broadcast_type_C, transA, transB, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }

    return ret;
}